

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_meta
                   (string *__return_storage_ptr__,MetaVariable *meta,uint32_t indent,
                   bool emit_type_name,string *varname)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  vtable_type *pvVar3;
  int iVar4;
  bool bVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t uVar9;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  size_t *psVar10;
  undefined1 closing_brace;
  _Base_ptr p_Var11;
  pprint *this;
  undefined1 auVar12 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  stringstream ss;
  undefined1 local_298 [16];
  _Rb_tree_node_base local_288;
  size_t local_268;
  string local_260;
  pprint *local_240;
  string *local_238;
  string local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_228;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  closing_brace = SUB81(varname,0);
  this = (pprint *)(ulong)indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  pcVar2 = (meta->_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar2,pcVar2 + (meta->_name)._M_string_length);
  if (local_260._M_string_length == 0) {
    ::std::__cxx11::string::_M_assign((string *)&local_260);
  }
  if (local_260._M_string_length == 0) {
    closing_brace = 0x11;
    ::std::__cxx11::string::_M_replace((ulong)&local_260,0,(char *)0x0,0x3c5550);
  }
  MetaVariable::
  get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
            ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              *)local_298,meta);
  local_230 = local_298[0];
  uVar9 = extraout_EDX;
  if (local_298[0] == (string)0x1) {
    p_Var1 = &local_228._M_impl.super__Rb_tree_header;
    if ((_Link_type)local_288._M_parent == (_Link_type)0x0) {
      psVar10 = &local_228._M_impl.super__Rb_tree_header._M_node_count;
      local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_228._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_228._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    else {
      local_228._M_impl.super__Rb_tree_header._M_header._M_color = local_288._M_color;
      local_228._M_impl.super__Rb_tree_header._M_header._M_parent = local_288._M_parent;
      local_228._M_impl.super__Rb_tree_header._M_header._M_left = local_288._M_left;
      local_228._M_impl.super__Rb_tree_header._M_header._M_right = local_288._M_right;
      *(_Rb_tree_header **)((long)local_288._M_parent + 8) = p_Var1;
      psVar10 = &local_268;
      local_228._M_impl.super__Rb_tree_header._M_node_count = local_268;
      local_288._M_parent = (_Base_ptr)0x0;
      local_288._M_left = &local_288;
      local_288._M_right = &local_288;
    }
    *psVar10 = 0;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)(local_298 + 8),(_Link_type)local_288._M_parent);
    uVar9 = extraout_EDX_00;
  }
  if (local_230 == (string)0x1) {
    local_240 = this;
    local_238 = __return_storage_ptr__;
    if ((local_260._M_string_length == 0) ||
       (bVar5 = is_valid_utf8_identifier(&local_260), uVar9 = extraout_EDX_01, !bVar5)) {
      local_1d8 = local_1c8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\"","");
      local_298._0_8_ = &local_288;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_298,local_1d8,local_1d0 + (long)local_1d8);
      ::std::__cxx11::string::_M_append(local_298,(ulong)local_260._M_dataplus._M_p);
      plVar6 = (long *)::std::__cxx11::string::_M_append(local_298,(ulong)local_1d8);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_1e8 = *plVar8;
        lStack_1e0 = plVar6[3];
        local_1f8 = &local_1e8;
      }
      else {
        local_1e8 = *plVar8;
        local_1f8 = (long *)*plVar6;
      }
      local_1f0 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
      }
      ::std::__cxx11::string::operator=((string *)&local_260,(string *)&local_1f8);
      uVar9 = extraout_EDX_02;
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
        uVar9 = extraout_EDX_03;
      }
      this = local_240;
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
        uVar9 = extraout_EDX_04;
      }
    }
    pprint::Indent_abi_cxx11_((string *)local_298,(pprint *)((ulong)this & 0xffffffff),uVar9);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_298._0_8_,local_298._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"dictionary ",0xb);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," = {\n",5);
    uVar9 = extraout_EDX_05;
    if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
      uVar9 = extraout_EDX_06;
    }
    if (local_230 == (string)0x0) {
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x591,
                    "value_type &nonstd::optional_lite::optional<std::map<std::basic_string<char>, tinyusdz::MetaVariable>>::value() [T = std::map<std::basic_string<char>, tinyusdz::MetaVariable>]"
                   );
    }
    p_Var1 = &local_228._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_228._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      iVar4 = (int)local_240;
      p_Var11 = local_228._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        print_meta((string *)local_298,(MetaVariable *)(p_Var11 + 2),iVar4 + 1,true,
                   (string *)(p_Var11 + 1));
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_298._0_8_,local_298._8_8_);
        if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
        }
        auVar12 = ::std::_Rb_tree_increment(p_Var11);
        uVar9 = auVar12._8_4_;
        p_Var11 = auVar12._0_8_;
      } while ((_Rb_tree_header *)p_Var11 != p_Var1);
    }
    pprint::Indent_abi_cxx11_((string *)local_298,local_240,uVar9);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_298._0_8_,local_298._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
    __return_storage_ptr__ = local_238;
    if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
      __return_storage_ptr__ = local_238;
    }
  }
  else {
    pprint::Indent_abi_cxx11_((string *)local_298,this,uVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_298._0_8_,local_298._8_8_);
    if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
    }
    if (emit_type_name) {
      pvVar3 = (meta->_value).v_.vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        local_288._M_color = 0x64696f76;
        local_298._8_8_ = (anon_struct_8_0_00000001_for___align)0x4;
        local_288._4_4_ = local_288._4_4_ & 0xffffff00;
        local_298._0_8_ = &local_288;
      }
      else {
        (*pvVar3->type_name)((string *)local_298);
      }
      poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_298._0_8_,local_298._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
      }
    }
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
    value::pprint_value_abi_cxx11_
              ((string *)local_298,(value *)meta,(Value *)0x0,1,(bool)closing_brace);
    poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_298._0_8_,local_298._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if ((_Rb_tree_node_base *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,CONCAT44(local_288._4_4_,local_288._M_color) + 1);
    }
  }
  if (local_230 == (string)0x1) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_228,(_Link_type)local_228._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_meta(const MetaVariable &meta, const uint32_t indent, bool emit_type_name,
                       const std::string &varname) {
  std::stringstream ss;

  // ss << "TODO: isObject " << meta.is_object() << ", isValue " <<
  // meta.IsValue() << "\n";

  // Use varname if meta.name is empty
  std::string name = meta.get_name();
  if (name.empty()) {
    name = varname;
  }

  if (name.empty()) {
    name = "[ERROR:EmptyName]";
  }

  if (auto pv = meta.get_value<CustomDataType>()) {
    // dict
    if (!isValidIdentifier(name)) {
      // May contain "/", quote it
      name = quote(name);
    }
    ss << pprint::Indent(indent) << "dictionary " << name << " = {\n";
    for (const auto &item : pv.value()) {
      ss << print_meta(item.second, indent + 1, /* emit_type_name */true, item.first);
    }
    ss << pprint::Indent(indent) << "}\n";
  } else {
    ss << pprint::Indent(indent);
    if (emit_type_name) {
      ss << meta.type_name() << " ";
    }
    ss << name << " = "
       << pprint_value(meta.get_raw_value()) << "\n";
  }

  return ss.str();
}